

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Id __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::createSubgroupOperation
          (TGlslangToSpvTraverser *this,TOperator op,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,TBasicType typeProxy)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  Id IVar4;
  Op OVar5;
  Builder *this_00;
  pointer puVar6;
  Capability cap;
  Op local_70;
  uint local_6c;
  IdImmediate groupOperand;
  IdImmediate executionScope;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> spvGroupOperands;
  
  switch(op) {
  case EOpSubgroupElect:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    local_70 = OpGroupNonUniformElect;
    goto LAB_0034f2e9;
  case EOpSubgroupBroadcast:
  case EOpSubgroupBroadcastFirst:
  case EOpSubgroupBallot:
  case EOpSubgroupInverseBallot:
  case EOpSubgroupBallotBitExtract:
  case EOpSubgroupBallotBitCount:
  case EOpSubgroupBallotInclusiveBitCount:
  case EOpSubgroupBallotExclusiveBitCount:
  case EOpSubgroupBallotFindLSB:
  case EOpSubgroupBallotFindMSB:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    cap = CapabilityGroupNonUniformBallot;
    break;
  case EOpSubgroupShuffle:
  case EOpSubgroupShuffleXor:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    cap = CapabilityGroupNonUniformShuffle;
    break;
  case EOpSubgroupShuffleUp:
  case EOpSubgroupShuffleDown:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    cap = CapabilityGroupNonUniformShuffleRelative;
    break;
  case EOpSubgroupRotate:
  case EOpSubgroupClusteredRotate:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_subgroup_rotate");
    cap = CapabilityGroupNonUniformRotateKHR;
    break;
  case EOpSubgroupAdd:
  case EOpSubgroupMul:
  case EOpSubgroupMin:
  case EOpSubgroupMax:
  case EOpSubgroupAnd:
  case EOpSubgroupOr:
  case EOpSubgroupXor:
  case EOpSubgroupInclusiveAdd:
  case EOpSubgroupInclusiveMul:
  case EOpSubgroupInclusiveMin:
  case EOpSubgroupInclusiveMax:
  case EOpSubgroupInclusiveAnd:
  case EOpSubgroupInclusiveOr:
  case EOpSubgroupInclusiveXor:
  case EOpSubgroupExclusiveAdd:
  case EOpSubgroupExclusiveMul:
  case EOpSubgroupExclusiveMin:
  case EOpSubgroupExclusiveMax:
  case EOpSubgroupExclusiveAnd:
  case EOpSubgroupExclusiveOr:
  case EOpSubgroupExclusiveXor:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    cap = CapabilityGroupNonUniformArithmetic;
    break;
  case EOpSubgroupClusteredAdd:
  case EOpSubgroupClusteredMul:
  case EOpSubgroupClusteredMin:
  case EOpSubgroupClusteredMax:
  case EOpSubgroupClusteredAnd:
  case EOpSubgroupClusteredOr:
  case EOpSubgroupClusteredXor:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    cap = CapabilityGroupNonUniformClustered;
    break;
  case EOpSubgroupQuadBroadcast:
  case EOpSubgroupQuadSwapHorizontal:
  case EOpSubgroupQuadSwapVertical:
  case EOpSubgroupQuadSwapDiagonal:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    cap = CapabilityGroupNonUniformQuad;
    break;
  case EOpSubgroupQuadAll:
  case EOpSubgroupQuadAny:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_quad_control");
    spv::Builder::addCapability(&this->builder,CapabilityQuadControlKHR);
  case EOpSubgroupAll:
  case EOpSubgroupAny:
  case EOpSubgroupAllEqual:
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    cap = CapabilityGroupNonUniformVote;
    break;
  default:
    __assert_fail("0 && \"Unhandled subgroup operation!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x2285,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSubgroupOperation(glslang::TOperator, spv::Id, std::vector<spv::Id> &, glslang::TBasicType)"
                 );
  case EOpSubgroupPartitionedAdd:
  case EOpSubgroupPartitionedMul:
  case EOpSubgroupPartitionedMin:
  case EOpSubgroupPartitionedMax:
  case EOpSubgroupPartitionedAnd:
  case EOpSubgroupPartitionedOr:
  case EOpSubgroupPartitionedXor:
  case EOpSubgroupPartitionedInclusiveAdd:
  case EOpSubgroupPartitionedInclusiveMul:
  case EOpSubgroupPartitionedInclusiveMin:
  case EOpSubgroupPartitionedInclusiveMax:
  case EOpSubgroupPartitionedInclusiveAnd:
  case EOpSubgroupPartitionedInclusiveOr:
  case EOpSubgroupPartitionedInclusiveXor:
  case EOpSubgroupPartitionedExclusiveAdd:
  case EOpSubgroupPartitionedExclusiveMul:
  case EOpSubgroupPartitionedExclusiveMin:
  case EOpSubgroupPartitionedExclusiveMax:
  case EOpSubgroupPartitionedExclusiveAnd:
  case EOpSubgroupPartitionedExclusiveOr:
  case EOpSubgroupPartitionedExclusiveXor:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_subgroup_partitioned");
    cap = CapabilityGroupNonUniformPartitionedNV;
  }
  spv::Builder::addCapability(&this->builder,cap);
  if (0x4a < op - EOpSubgroupAll) {
switchD_0034f04c_caseD_fa:
    __assert_fail("0 && \"Unhandled subgroup operation!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x230a,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSubgroupOperation(glslang::TOperator, spv::Id, std::vector<spv::Id> &, glslang::TBasicType)"
                 );
  }
  uVar1 = typeProxy - EbtFloat;
  bVar2 = true;
  switch(op) {
  case EOpSubgroupAll:
    local_70 = OpGroupNonUniformAll;
    break;
  case EOpSubgroupAny:
    local_70 = OpGroupNonUniformAny;
    break;
  case EOpSubgroupAllEqual:
    local_70 = OpGroupNonUniformAllEqual;
    break;
  case EOpSubgroupBroadcast:
    local_70 = OpGroupNonUniformBroadcast;
    break;
  case EOpSubgroupBroadcastFirst:
    local_70 = OpGroupNonUniformBroadcastFirst;
    break;
  case EOpSubgroupBallot:
    local_70 = OpGroupNonUniformBallot;
    break;
  case EOpSubgroupInverseBallot:
    local_70 = OpGroupNonUniformInverseBallot;
    break;
  case EOpSubgroupBallotBitExtract:
    local_70 = OpGroupNonUniformBallotBitExtract;
    break;
  case EOpSubgroupBallotBitCount:
  case EOpSubgroupBallotInclusiveBitCount:
  case EOpSubgroupBallotExclusiveBitCount:
    local_70 = OpGroupNonUniformBallotBitCount;
    goto LAB_0034f0da;
  case EOpSubgroupBallotFindLSB:
    local_70 = OpGroupNonUniformBallotFindLSB;
    break;
  case EOpSubgroupBallotFindMSB:
    local_70 = OpGroupNonUniformBallotFindMSB;
    break;
  case EOpSubgroupShuffle:
    local_70 = OpGroupNonUniformShuffle;
    break;
  case EOpSubgroupShuffleXor:
    local_70 = OpGroupNonUniformShuffleXor;
    break;
  case EOpSubgroupShuffleUp:
    local_70 = OpGroupNonUniformShuffleUp;
    break;
  case EOpSubgroupShuffleDown:
    local_70 = OpGroupNonUniformShuffleDown;
    break;
  case EOpSubgroupRotate:
  case EOpSubgroupClusteredRotate:
    local_70 = OpGroupNonUniformRotateKHR;
    goto LAB_0034f0da;
  default:
    local_70 = (uVar1 < 3) + OpGroupNonUniformIAdd;
    goto LAB_0034f0da;
  case EOpSubgroupMul:
  case EOpSubgroupInclusiveMul:
  case EOpSubgroupExclusiveMul:
  case EOpSubgroupClusteredMul:
  case EOpSubgroupPartitionedMul:
  case EOpSubgroupPartitionedInclusiveMul:
  case EOpSubgroupPartitionedExclusiveMul:
    local_70 = (uVar1 < 3) + OpGroupNonUniformIMul;
    goto LAB_0034f0da;
  case EOpSubgroupMin:
  case EOpSubgroupInclusiveMin:
  case EOpSubgroupExclusiveMin:
  case EOpSubgroupClusteredMin:
  case EOpSubgroupPartitionedMin:
  case EOpSubgroupPartitionedInclusiveMin:
  case EOpSubgroupPartitionedExclusiveMin:
    OVar5 = ((typeProxy - EbtUint8 & 0xfffffff9) == 0) + OpGroupNonUniformSMin;
    local_70 = OpGroupNonUniformFMin;
    goto LAB_0034f09c;
  case EOpSubgroupMax:
  case EOpSubgroupInclusiveMax:
  case EOpSubgroupExclusiveMax:
  case EOpSubgroupClusteredMax:
  case EOpSubgroupPartitionedMax:
  case EOpSubgroupPartitionedInclusiveMax:
  case EOpSubgroupPartitionedExclusiveMax:
    OVar5 = ((typeProxy - EbtUint8 & 0xfffffff9) == 0) + OpGroupNonUniformSMax;
    local_70 = OpGroupNonUniformFMax;
LAB_0034f09c:
    if (2 < uVar1) {
      local_70 = OVar5;
    }
    goto LAB_0034f0da;
  case EOpSubgroupAnd:
  case EOpSubgroupInclusiveAnd:
  case EOpSubgroupExclusiveAnd:
  case EOpSubgroupClusteredAnd:
  case EOpSubgroupPartitionedAnd:
  case EOpSubgroupPartitionedInclusiveAnd:
  case EOpSubgroupPartitionedExclusiveAnd:
    local_70 = (uint)(typeProxy == EbtBool) * 3 + OpGroupNonUniformBitwiseAnd;
    goto LAB_0034f0da;
  case EOpSubgroupOr:
  case EOpSubgroupInclusiveOr:
  case EOpSubgroupExclusiveOr:
  case EOpSubgroupClusteredOr:
  case EOpSubgroupPartitionedOr:
  case EOpSubgroupPartitionedInclusiveOr:
  case EOpSubgroupPartitionedExclusiveOr:
    local_70 = (uint)(typeProxy == EbtBool) * 3 + OpGroupNonUniformBitwiseOr;
    goto LAB_0034f0da;
  case EOpSubgroupXor:
  case EOpSubgroupInclusiveXor:
  case EOpSubgroupExclusiveXor:
  case EOpSubgroupClusteredXor:
  case EOpSubgroupPartitionedXor:
  case EOpSubgroupPartitionedInclusiveXor:
  case EOpSubgroupPartitionedExclusiveXor:
    local_70 = (uint)(typeProxy == EbtBool) * 3 + OpGroupNonUniformBitwiseXor;
    goto LAB_0034f0da;
  case EOpSubgroupQuadBroadcast:
    local_70 = OpGroupNonUniformQuadBroadcast;
    break;
  case EOpSubgroupQuadSwapHorizontal:
  case EOpSubgroupQuadSwapVertical:
  case EOpSubgroupQuadSwapDiagonal:
    local_70 = OpGroupNonUniformQuadSwap;
LAB_0034f0da:
    bVar3 = true;
    switch(op) {
    case EOpSubgroupBallotBitCount:
    case EOpSubgroupAdd:
    case EOpSubgroupMul:
    case EOpSubgroupMin:
    case EOpSubgroupMax:
    case EOpSubgroupAnd:
    case EOpSubgroupOr:
    case EOpSubgroupXor:
      bVar2 = false;
      local_6c = 0;
      goto LAB_0034f2ec;
    case EOpSubgroupBallotInclusiveBitCount:
    case EOpSubgroupInclusiveAdd:
    case EOpSubgroupInclusiveMul:
    case EOpSubgroupInclusiveMin:
    case EOpSubgroupInclusiveMax:
    case EOpSubgroupInclusiveAnd:
    case EOpSubgroupInclusiveOr:
    case EOpSubgroupInclusiveXor:
      local_6c = 1;
      break;
    case EOpSubgroupBallotExclusiveBitCount:
    case EOpSubgroupExclusiveAdd:
    case EOpSubgroupExclusiveMul:
    case EOpSubgroupExclusiveMin:
    case EOpSubgroupExclusiveMax:
    case EOpSubgroupExclusiveAnd:
    case EOpSubgroupExclusiveOr:
    case EOpSubgroupExclusiveXor:
      local_6c = 2;
      break;
    default:
      local_6c = 0x7fffffff;
      bVar2 = true;
      goto LAB_0034f2ec;
    case EOpSubgroupClusteredAdd:
    case EOpSubgroupClusteredMul:
    case EOpSubgroupClusteredMin:
    case EOpSubgroupClusteredMax:
    case EOpSubgroupClusteredAnd:
    case EOpSubgroupClusteredOr:
    case EOpSubgroupClusteredXor:
      local_6c = 3;
      break;
    case EOpSubgroupPartitionedAdd:
    case EOpSubgroupPartitionedMul:
    case EOpSubgroupPartitionedMin:
    case EOpSubgroupPartitionedMax:
    case EOpSubgroupPartitionedAnd:
    case EOpSubgroupPartitionedOr:
    case EOpSubgroupPartitionedXor:
      local_6c = 6;
      break;
    case EOpSubgroupPartitionedInclusiveAdd:
    case EOpSubgroupPartitionedInclusiveMul:
    case EOpSubgroupPartitionedInclusiveMin:
    case EOpSubgroupPartitionedInclusiveMax:
    case EOpSubgroupPartitionedInclusiveAnd:
    case EOpSubgroupPartitionedInclusiveOr:
    case EOpSubgroupPartitionedInclusiveXor:
      local_6c = 7;
      break;
    case EOpSubgroupPartitionedExclusiveAdd:
    case EOpSubgroupPartitionedExclusiveMul:
    case EOpSubgroupPartitionedExclusiveMin:
    case EOpSubgroupPartitionedExclusiveMax:
    case EOpSubgroupPartitionedExclusiveAnd:
    case EOpSubgroupPartitionedExclusiveOr:
    case EOpSubgroupPartitionedExclusiveXor:
      local_6c = 8;
    }
    bVar2 = false;
    goto LAB_0034f2ec;
  case EOpSubgroupQuadAll:
    local_70 = OpGroupNonUniformQuadAllKHR;
    goto LAB_0034f2be;
  case EOpSubgroupQuadAny:
    local_70 = OpGroupNonUniformQuadAnyKHR;
LAB_0034f2be:
    local_6c = 0x7fffffff;
    bVar3 = false;
    goto LAB_0034f2ec;
  case EOpSubgroupPartition:
    goto switchD_0034f04c_caseD_fa;
  }
LAB_0034f2e9:
  local_6c = 0x7fffffff;
  bVar2 = true;
  bVar3 = true;
LAB_0034f2ec:
  spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->builder;
  executionScope.word = spv::Builder::makeUintConstant(this_00,3,false);
  executionScope.isId = true;
  if (bVar3) {
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
              (&spvGroupOperands,&executionScope);
  }
  if (!bVar2) {
    groupOperand.isId = false;
    groupOperand.word = local_6c;
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
              (&spvGroupOperands,&groupOperand);
  }
  for (puVar6 = (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar6 != (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
    groupOperand.word = *puVar6;
    groupOperand.isId = true;
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
              (&spvGroupOperands,&groupOperand);
  }
  if ((op - EOpSubgroupQuadSwapHorizontal < 3) &&
     (IVar4 = spv::Builder::makeUintConstant(this_00,op - EOpSubgroupQuadSwapHorizontal,false),
     IVar4 != 0)) {
    groupOperand.isId = true;
    groupOperand.word = IVar4;
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
              (&spvGroupOperands,&groupOperand);
  }
  IVar4 = spv::Builder::createOp
                    (this_00,local_70,typeId,
                     (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                     &spvGroupOperands.
                      super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>);
  std::_Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::~_Vector_base
            (&spvGroupOperands.
              super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>);
  return IVar4;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createSubgroupOperation(glslang::TOperator op, spv::Id typeId,
    std::vector<spv::Id>& operands, glslang::TBasicType typeProxy)
{
    // Add the required capabilities.
    switch (op) {
    case glslang::EOpSubgroupElect:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        break;
    case glslang::EOpSubgroupQuadAll:
    case glslang::EOpSubgroupQuadAny:
        builder.addExtension(spv::E_SPV_KHR_quad_control);
        builder.addCapability(spv::CapabilityQuadControlKHR);
        [[fallthrough]];
    case glslang::EOpSubgroupAll:
    case glslang::EOpSubgroupAny:
    case glslang::EOpSubgroupAllEqual:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformVote);
        break;
    case glslang::EOpSubgroupBroadcast:
    case glslang::EOpSubgroupBroadcastFirst:
    case glslang::EOpSubgroupBallot:
    case glslang::EOpSubgroupInverseBallot:
    case glslang::EOpSubgroupBallotBitExtract:
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupBallotExclusiveBitCount:
    case glslang::EOpSubgroupBallotFindLSB:
    case glslang::EOpSubgroupBallotFindMSB:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        break;
    case glslang::EOpSubgroupRotate:
    case glslang::EOpSubgroupClusteredRotate:
        builder.addExtension(spv::E_SPV_KHR_subgroup_rotate);
        builder.addCapability(spv::CapabilityGroupNonUniformRotateKHR);
        break;
    case glslang::EOpSubgroupShuffle:
    case glslang::EOpSubgroupShuffleXor:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformShuffle);
        break;
    case glslang::EOpSubgroupShuffleUp:
    case glslang::EOpSubgroupShuffleDown:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformShuffleRelative);
        break;
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupXor:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupInclusiveXor:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupExclusiveXor:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
        break;
    case glslang::EOpSubgroupClusteredAdd:
    case glslang::EOpSubgroupClusteredMul:
    case glslang::EOpSubgroupClusteredMin:
    case glslang::EOpSubgroupClusteredMax:
    case glslang::EOpSubgroupClusteredAnd:
    case glslang::EOpSubgroupClusteredOr:
    case glslang::EOpSubgroupClusteredXor:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformClustered);
        break;
    case glslang::EOpSubgroupQuadBroadcast:
    case glslang::EOpSubgroupQuadSwapHorizontal:
    case glslang::EOpSubgroupQuadSwapVertical:
    case glslang::EOpSubgroupQuadSwapDiagonal:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformQuad);
        break;
    case glslang::EOpSubgroupPartitionedAdd:
    case glslang::EOpSubgroupPartitionedMul:
    case glslang::EOpSubgroupPartitionedMin:
    case glslang::EOpSubgroupPartitionedMax:
    case glslang::EOpSubgroupPartitionedAnd:
    case glslang::EOpSubgroupPartitionedOr:
    case glslang::EOpSubgroupPartitionedXor:
    case glslang::EOpSubgroupPartitionedInclusiveAdd:
    case glslang::EOpSubgroupPartitionedInclusiveMul:
    case glslang::EOpSubgroupPartitionedInclusiveMin:
    case glslang::EOpSubgroupPartitionedInclusiveMax:
    case glslang::EOpSubgroupPartitionedInclusiveAnd:
    case glslang::EOpSubgroupPartitionedInclusiveOr:
    case glslang::EOpSubgroupPartitionedInclusiveXor:
    case glslang::EOpSubgroupPartitionedExclusiveAdd:
    case glslang::EOpSubgroupPartitionedExclusiveMul:
    case glslang::EOpSubgroupPartitionedExclusiveMin:
    case glslang::EOpSubgroupPartitionedExclusiveMax:
    case glslang::EOpSubgroupPartitionedExclusiveAnd:
    case glslang::EOpSubgroupPartitionedExclusiveOr:
    case glslang::EOpSubgroupPartitionedExclusiveXor:
        builder.addExtension(spv::E_SPV_NV_shader_subgroup_partitioned);
        builder.addCapability(spv::CapabilityGroupNonUniformPartitionedNV);
        break;
    default: assert(0 && "Unhandled subgroup operation!");
    }


    const bool isUnsigned = isTypeUnsignedInt(typeProxy);
    const bool isFloat = isTypeFloat(typeProxy);
    const bool isBool = typeProxy == glslang::EbtBool;

    spv::Op opCode = spv::OpNop;

    // Figure out which opcode to use.
    switch (op) {
    case glslang::EOpSubgroupElect:                   opCode = spv::OpGroupNonUniformElect; break;
    case glslang::EOpSubgroupQuadAll:                 opCode = spv::OpGroupNonUniformQuadAllKHR; break;
    case glslang::EOpSubgroupAll:                     opCode = spv::OpGroupNonUniformAll; break;
    case glslang::EOpSubgroupQuadAny:                 opCode = spv::OpGroupNonUniformQuadAnyKHR; break;
    case glslang::EOpSubgroupAny:                     opCode = spv::OpGroupNonUniformAny; break;
    case glslang::EOpSubgroupAllEqual:                opCode = spv::OpGroupNonUniformAllEqual; break;
    case glslang::EOpSubgroupBroadcast:               opCode = spv::OpGroupNonUniformBroadcast; break;
    case glslang::EOpSubgroupBroadcastFirst:          opCode = spv::OpGroupNonUniformBroadcastFirst; break;
    case glslang::EOpSubgroupBallot:                  opCode = spv::OpGroupNonUniformBallot; break;
    case glslang::EOpSubgroupInverseBallot:           opCode = spv::OpGroupNonUniformInverseBallot; break;
    case glslang::EOpSubgroupBallotBitExtract:        opCode = spv::OpGroupNonUniformBallotBitExtract; break;
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupBallotExclusiveBitCount: opCode = spv::OpGroupNonUniformBallotBitCount; break;
    case glslang::EOpSubgroupBallotFindLSB:           opCode = spv::OpGroupNonUniformBallotFindLSB; break;
    case glslang::EOpSubgroupBallotFindMSB:           opCode = spv::OpGroupNonUniformBallotFindMSB; break;
    case glslang::EOpSubgroupShuffle:                 opCode = spv::OpGroupNonUniformShuffle; break;
    case glslang::EOpSubgroupShuffleXor:              opCode = spv::OpGroupNonUniformShuffleXor; break;
    case glslang::EOpSubgroupShuffleUp:               opCode = spv::OpGroupNonUniformShuffleUp; break;
    case glslang::EOpSubgroupShuffleDown:             opCode = spv::OpGroupNonUniformShuffleDown; break;
    case glslang::EOpSubgroupRotate:
    case glslang::EOpSubgroupClusteredRotate:         opCode = spv::OpGroupNonUniformRotateKHR; break;
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupClusteredAdd:
    case glslang::EOpSubgroupPartitionedAdd:
    case glslang::EOpSubgroupPartitionedInclusiveAdd:
    case glslang::EOpSubgroupPartitionedExclusiveAdd:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFAdd;
        } else {
            opCode = spv::OpGroupNonUniformIAdd;
        }
        break;
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupClusteredMul:
    case glslang::EOpSubgroupPartitionedMul:
    case glslang::EOpSubgroupPartitionedInclusiveMul:
    case glslang::EOpSubgroupPartitionedExclusiveMul:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFMul;
        } else {
            opCode = spv::OpGroupNonUniformIMul;
        }
        break;
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupClusteredMin:
    case glslang::EOpSubgroupPartitionedMin:
    case glslang::EOpSubgroupPartitionedInclusiveMin:
    case glslang::EOpSubgroupPartitionedExclusiveMin:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFMin;
        } else if (isUnsigned) {
            opCode = spv::OpGroupNonUniformUMin;
        } else {
            opCode = spv::OpGroupNonUniformSMin;
        }
        break;
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupClusteredMax:
    case glslang::EOpSubgroupPartitionedMax:
    case glslang::EOpSubgroupPartitionedInclusiveMax:
    case glslang::EOpSubgroupPartitionedExclusiveMax:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFMax;
        } else if (isUnsigned) {
            opCode = spv::OpGroupNonUniformUMax;
        } else {
            opCode = spv::OpGroupNonUniformSMax;
        }
        break;
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupClusteredAnd:
    case glslang::EOpSubgroupPartitionedAnd:
    case glslang::EOpSubgroupPartitionedInclusiveAnd:
    case glslang::EOpSubgroupPartitionedExclusiveAnd:
        if (isBool) {
            opCode = spv::OpGroupNonUniformLogicalAnd;
        } else {
            opCode = spv::OpGroupNonUniformBitwiseAnd;
        }
        break;
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupClusteredOr:
    case glslang::EOpSubgroupPartitionedOr:
    case glslang::EOpSubgroupPartitionedInclusiveOr:
    case glslang::EOpSubgroupPartitionedExclusiveOr:
        if (isBool) {
            opCode = spv::OpGroupNonUniformLogicalOr;
        } else {
            opCode = spv::OpGroupNonUniformBitwiseOr;
        }
        break;
    case glslang::EOpSubgroupXor:
    case glslang::EOpSubgroupInclusiveXor:
    case glslang::EOpSubgroupExclusiveXor:
    case glslang::EOpSubgroupClusteredXor:
    case glslang::EOpSubgroupPartitionedXor:
    case glslang::EOpSubgroupPartitionedInclusiveXor:
    case glslang::EOpSubgroupPartitionedExclusiveXor:
        if (isBool) {
            opCode = spv::OpGroupNonUniformLogicalXor;
        } else {
            opCode = spv::OpGroupNonUniformBitwiseXor;
        }
        break;
    case glslang::EOpSubgroupQuadBroadcast:      opCode = spv::OpGroupNonUniformQuadBroadcast; break;
    case glslang::EOpSubgroupQuadSwapHorizontal:
    case glslang::EOpSubgroupQuadSwapVertical:
    case glslang::EOpSubgroupQuadSwapDiagonal:   opCode = spv::OpGroupNonUniformQuadSwap; break;
    default: assert(0 && "Unhandled subgroup operation!");
    }

    // get the right Group Operation
    spv::GroupOperation groupOperation = spv::GroupOperationMax;
    switch (op) {
    default:
        break;
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupXor:
        groupOperation = spv::GroupOperationReduce;
        break;
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupInclusiveXor:
        groupOperation = spv::GroupOperationInclusiveScan;
        break;
    case glslang::EOpSubgroupBallotExclusiveBitCount:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupExclusiveXor:
        groupOperation = spv::GroupOperationExclusiveScan;
        break;
    case glslang::EOpSubgroupClusteredAdd:
    case glslang::EOpSubgroupClusteredMul:
    case glslang::EOpSubgroupClusteredMin:
    case glslang::EOpSubgroupClusteredMax:
    case glslang::EOpSubgroupClusteredAnd:
    case glslang::EOpSubgroupClusteredOr:
    case glslang::EOpSubgroupClusteredXor:
        groupOperation = spv::GroupOperationClusteredReduce;
        break;
    case glslang::EOpSubgroupPartitionedAdd:
    case glslang::EOpSubgroupPartitionedMul:
    case glslang::EOpSubgroupPartitionedMin:
    case glslang::EOpSubgroupPartitionedMax:
    case glslang::EOpSubgroupPartitionedAnd:
    case glslang::EOpSubgroupPartitionedOr:
    case glslang::EOpSubgroupPartitionedXor:
        groupOperation = spv::GroupOperationPartitionedReduceNV;
        break;
    case glslang::EOpSubgroupPartitionedInclusiveAdd:
    case glslang::EOpSubgroupPartitionedInclusiveMul:
    case glslang::EOpSubgroupPartitionedInclusiveMin:
    case glslang::EOpSubgroupPartitionedInclusiveMax:
    case glslang::EOpSubgroupPartitionedInclusiveAnd:
    case glslang::EOpSubgroupPartitionedInclusiveOr:
    case glslang::EOpSubgroupPartitionedInclusiveXor:
        groupOperation = spv::GroupOperationPartitionedInclusiveScanNV;
        break;
    case glslang::EOpSubgroupPartitionedExclusiveAdd:
    case glslang::EOpSubgroupPartitionedExclusiveMul:
    case glslang::EOpSubgroupPartitionedExclusiveMin:
    case glslang::EOpSubgroupPartitionedExclusiveMax:
    case glslang::EOpSubgroupPartitionedExclusiveAnd:
    case glslang::EOpSubgroupPartitionedExclusiveOr:
    case glslang::EOpSubgroupPartitionedExclusiveXor:
        groupOperation = spv::GroupOperationPartitionedExclusiveScanNV;
        break;
    }

    // build the instruction
    std::vector<spv::IdImmediate> spvGroupOperands;

    // Every operation begins with the Execution Scope operand.
    spv::IdImmediate executionScope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
    // All other ops need the execution scope. Quad Control Ops don't need scope, it's always Quad.
    if (opCode != spv::OpGroupNonUniformQuadAllKHR && opCode != spv::OpGroupNonUniformQuadAnyKHR) {
        spvGroupOperands.push_back(executionScope);
    }

    // Next, for all operations that use a Group Operation, push that as an operand.
    if (groupOperation != spv::GroupOperationMax) {
        spv::IdImmediate groupOperand = { false, (unsigned)groupOperation };
        spvGroupOperands.push_back(groupOperand);
    }

    // Push back the operands next.
    for (auto opIt = operands.cbegin(); opIt != operands.cend(); ++opIt) {
        spv::IdImmediate operand = { true, *opIt };
        spvGroupOperands.push_back(operand);
    }

    // Some opcodes have additional operands.
    spv::Id directionId = spv::NoResult;
    switch (op) {
    default: break;
    case glslang::EOpSubgroupQuadSwapHorizontal: directionId = builder.makeUintConstant(0); break;
    case glslang::EOpSubgroupQuadSwapVertical:   directionId = builder.makeUintConstant(1); break;
    case glslang::EOpSubgroupQuadSwapDiagonal:   directionId = builder.makeUintConstant(2); break;
    }
    if (directionId != spv::NoResult) {
        spv::IdImmediate direction = { true, directionId };
        spvGroupOperands.push_back(direction);
    }

    return builder.createOp(opCode, typeId, spvGroupOperands);
}